

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O1

TShaderStages * __thiscall
Diligent::PipelineStateVkImpl::InitInternalObjects<Diligent::RayTracingPipelineStateCreateInfo>
          (TShaderStages *__return_storage_ptr__,PipelineStateVkImpl *this,
          RayTracingPipelineStateCreateInfo *CreateInfo,
          vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
          *vkShaderStages,
          vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
          *ShaderModules)

{
  VulkanLogicalDevice *LogicalDevice;
  RenderDeviceVkImpl *pRVar1;
  FixedLinearAllocator MemPool;
  FixedLinearAllocator local_88;
  
  (__return_storage_ptr__->
  super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PipelineStateBase<Diligent::EngineVkImplTraits>::
  ExtractShaders<Diligent::ShaderVkImpl,Diligent::RayTracingPipelineStateCreateInfo,std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>>>
            (&this->super_PipelineStateBase<Diligent::EngineVkImplTraits>,CreateInfo,
             __return_storage_ptr__,true);
  local_88.m_pAllocator = GetRawAllocator();
  local_88.m_ReservedSize = 0;
  local_88.m_CurrAlignment = 0;
  local_88.m_pDataStart = (uint8_t *)0x0;
  local_88.m_pCurrPtr = (uint8_t *)0x0;
  local_88.m_DbgCurrAllocation = 0;
  local_88.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.m_DbgUsingExternalMemory = false;
  PipelineStateBase<Diligent::EngineVkImplTraits>::ReserveSpaceForPipelineDesc
            (&this->super_PipelineStateBase<Diligent::EngineVkImplTraits>,CreateInfo,&local_88);
  FixedLinearAllocator::Reserve(&local_88);
  pRVar1 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
           ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                        *)this);
  LogicalDevice =
       (pRVar1->m_LogicalVkDevice).
       super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  PipelineStateBase<Diligent::EngineVkImplTraits>::InitializePipelineDesc
            (&this->super_PipelineStateBase<Diligent::EngineVkImplTraits>,CreateInfo,&local_88);
  InitPipelineLayout(this,&CreateInfo->super_PipelineStateCreateInfo,__return_storage_ptr__);
  anon_unknown_231::InitPipelineShaderStages
            (LogicalDevice,__return_storage_ptr__,ShaderModules,vkShaderStages);
  FixedLinearAllocator::~FixedLinearAllocator(&local_88);
  return __return_storage_ptr__;
}

Assistant:

PipelineStateVkImpl::TShaderStages PipelineStateVkImpl::InitInternalObjects(
    const PSOCreateInfoType&                           CreateInfo,
    std::vector<VkPipelineShaderStageCreateInfo>&      vkShaderStages,
    std::vector<VulkanUtilities::ShaderModuleWrapper>& ShaderModules) noexcept(false)
{
    TShaderStages ShaderStages;
    ExtractShaders<ShaderVkImpl>(CreateInfo, ShaderStages, /*WaitUntilShadersReady = */ true);

    FixedLinearAllocator MemPool{GetRawAllocator()};

    ReserveSpaceForPipelineDesc(CreateInfo, MemPool);

    MemPool.Reserve();

    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = GetDevice()->GetLogicalDevice();

    InitializePipelineDesc(CreateInfo, MemPool);

    InitPipelineLayout(CreateInfo, ShaderStages);

    // Create shader modules and initialize shader stages
    InitPipelineShaderStages(LogicalDevice, ShaderStages, ShaderModules, vkShaderStages);

    return ShaderStages;
}